

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViewState.cpp
# Opt level: O3

void __thiscall ViewState::handle_message(ViewState *this,Message *msg,Node *node)

{
  network_address_t nVar1;
  size_t sVar2;
  ulong uVar3;
  state_t sVar4;
  Block bNew;
  Block local_b8;
  
  sVar4 = this->_state;
  if (sVar4 == WAIT_BLOCK) {
    if (msg->msg_type == UNPACK) {
      Node::GetOutBk(node);
      return;
    }
  }
  else if (sVar4 == COMFIRM_TRANS) {
    sVar2 = this->accepted_confirm;
    if (msg->msg_type == CONFIRM) {
      sVar2 = sVar2 + 1;
      this->accepted_confirm = sVar2;
    }
    if (sVar2 == 2) {
      Node::TransToCache(node,msg);
      Node::SealTrans(&local_b8,node);
      uVar3 = msg->n * -0x70a3d70a3d70a3d7 + 0x8f5c28f5c28f5c29;
      sVar4 = WAIT_BLOCK;
      if ((uVar3 >> 4 | uVar3 << 0x3c) < 0xa3d70a3d70a3d8) {
        Node::SendBlock(node,&local_b8);
        sVar4 = SEND_BLOCK;
        Node::SendUnpack(node,msg);
      }
      this->_state = sVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._bData._M_dataplus._M_p != &local_b8._bData.field_2) {
        operator_delete(local_b8._bData._M_dataplus._M_p,
                        local_b8._bData.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.merkle_root._M_dataplus._M_p != &local_b8.merkle_root.field_2) {
        operator_delete(local_b8.merkle_root._M_dataplus._M_p,
                        local_b8.merkle_root.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._bHash._M_dataplus._M_p != &local_b8._bHash.field_2) {
        operator_delete(local_b8._bHash._M_dataplus._M_p,
                        local_b8._bHash.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.bPrevHash._M_dataplus._M_p != &local_b8.bPrevHash.field_2) {
        operator_delete(local_b8.bPrevHash._M_dataplus._M_p,
                        local_b8.bPrevHash.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (sVar4 == SEND_TRANS) {
    msg->msg_type = CONFIRM;
    nVar1 = Node::GetNodeAdd(node);
    msg->i = nVar1;
    sVar2 = Node::GetTransNum(node);
    msg->n = sVar2;
    Node::SendAll(node,msg);
    nVar1 = Node::GetNodeAdd(node);
    if (nVar1 == 2) {
      this->_state = COMFIRM_TRANS;
    }
    else {
      this->_state = WAIT_BLOCK;
    }
  }
  return;
}

Assistant:

void ViewState::handle_message(Message msg, Node & node) {
  switch (_state) {
  case SEND_TRANS: {
    // TODO：主节点验证客户端请求消息签名是否正确，如果正确，则
    msg.msg_type = Message::CONFIRM;
    msg.i = node.GetNodeAdd();
    msg.n = node.GetTransNum();
    node.SendAll(msg);
    if (node.GetNodeAdd() == 2)
      _state = COMFIRM_TRANS;
    else {
      _state = WAIT_BLOCK;
    }
  }
  break;
  case WAIT_BLOCK:
  {
    if (msg.msg_type == Message::UNPACK)
    {
      //std::cout << "节点：" << node.GetNodeAdd() <<" 添加区块。"<<std::endl;
      node.GetOutBk();
    }

  }
  break;
  case COMFIRM_TRANS: {
    // TODO：副本节点验证
    //  a. 主节点PRE-PREPARE消息签名是否正确。
    //  b. 当前副本节点是否已经收到了一条在同一v下并且编号也是n，但是签名不同的PRE-PREPARE信息。
    //  c. d与m的摘要是否一致。
    //  d. n是否在区间[h, H]内。
    //  如果正确，则

    if (msg.msg_type == Message::CONFIRM) {
      accepted_confirm++;
    }
    if (accepted_confirm == k_value) // TODO:K_CA
    {
        //std::cout << "节点：" << node.GetNodeAdd() << " 达到k确认！"
                  //<< std::endl;
        node.TransToCache(msg);
        Block bNew = node.SealTrans();
        if ((msg.n+1)%400 == 0)
        {
          node.SendBlock(bNew);
          node.SendUnpack(msg);
          _state = SEND_BLOCK;
        }
        else
          _state = WAIT_BLOCK;
    }
  }
  break;
  case SEND_BLOCK:
    break;
  }
}